

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O3

void __thiscall PathBuilder::write_out(PathBuilder *this,ostream *out)

{
  pointer pdVar1;
  ostream *poVar2;
  _Elt_pointer pPVar3;
  _Elt_pointer pPVar4;
  int iVar5;
  Point *point;
  _Elt_pointer pPVar6;
  pointer pdVar7;
  bool bVar8;
  _Map_pointer local_48;
  
  pdVar1 = (this->paths).
           super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pdVar7 = (this->paths).
                super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar7 != pdVar1; pdVar7 = pdVar7 + 1) {
    if ((pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
        _M_finish._M_cur !=
        (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 4;
      std::__ostream_insert<char,std::char_traits<char>>(out,"<path d=\"M",10);
      pPVar6 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pPVar3 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pPVar6 != pPVar3) {
        pPVar4 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last;
        local_48 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_node;
        iVar5 = 1;
        do {
          bVar8 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          if (bVar8) {
            std::__ostream_insert<char,std::char_traits<char>>(out,"L",1);
          }
          poVar2 = std::ostream::_M_insert<double>((double)pPVar6->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>((double)pPVar6->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          pPVar6 = pPVar6 + 1;
          if (pPVar6 == pPVar4) {
            pPVar6 = local_48[1];
            local_48 = local_48 + 1;
            pPVar4 = pPVar6 + 0x40;
          }
        } while (pPVar6 != pPVar3);
        pPVar6 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        pPVar3 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
      }
      if (pPVar3 == (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pPVar3 = (pdVar7->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if ((ABS(pPVar6->x - pPVar3[-1].x) < 1e-08) && (ABS(pPVar6->y - pPVar3[-1].y) < 1e-08)) {
        std::__ostream_insert<char,std::char_traits<char>>(out," Z",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\" />\n",5);
    }
  }
  return;
}

Assistant:

void PathBuilder::write_out(std::ostream &out) const {
    for (const auto &path : paths) {
        if (path.empty()) {
            continue;
        }
        out << std::setprecision(4);
        out<<"<path d=\"M";
        int count = 0;
        for (const auto &point : path) {
            if (count == 1) {
                out<<"L";
            }
            out<<point.x<<" "<<point.y<<" ";
            count++;
        }
        if (path.front() == path.back()) {
            out<<" Z";
        }
        out<<"\" />\n";
    }
}